

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

void __thiscall llvm::APInt::initFromArray(APInt *this,ArrayRef<unsigned_long> bigVal)

{
  bool bVar1;
  uint numWords;
  unsigned_long *puVar2;
  uint64_t *puVar3;
  size_t sVar4;
  uint *puVar5;
  uint local_2c;
  uint local_28;
  uint local_24;
  APInt *pAStack_20;
  uint words;
  APInt *this_local;
  ArrayRef<unsigned_long> bigVal_local;
  
  bigVal_local.Data = (unsigned_long *)bigVal.Length;
  this_local = (APInt *)bigVal.Data;
  pAStack_20 = this;
  if (this->BitWidth == 0) {
    __assert_fail("BitWidth && \"Bitwidth too small\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x5b,"void llvm::APInt::initFromArray(ArrayRef<uint64_t>)");
  }
  puVar2 = ArrayRef<unsigned_long>::data((ArrayRef<unsigned_long> *)&this_local);
  if (puVar2 == (unsigned_long *)0x0) {
    __assert_fail("bigVal.data() && \"Null pointer detected!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x5c,"void llvm::APInt::initFromArray(ArrayRef<uint64_t>)");
  }
  bVar1 = isSingleWord(this);
  if (bVar1) {
    puVar2 = ArrayRef<unsigned_long>::operator[]((ArrayRef<unsigned_long> *)&this_local,0);
    (this->U).VAL = *puVar2;
  }
  else {
    numWords = getNumWords(this);
    puVar3 = getClearedMemory(numWords);
    (this->U).pVal = puVar3;
    sVar4 = ArrayRef<unsigned_long>::size((ArrayRef<unsigned_long> *)&this_local);
    local_28 = (uint)sVar4;
    local_2c = getNumWords(this);
    puVar5 = std::min<unsigned_int>(&local_28,&local_2c);
    local_24 = *puVar5;
    puVar3 = (this->U).pVal;
    puVar2 = ArrayRef<unsigned_long>::data((ArrayRef<unsigned_long> *)&this_local);
    memcpy(puVar3,puVar2,(ulong)(local_24 << 3));
  }
  clearUnusedBits(this);
  return;
}

Assistant:

void APInt::initFromArray(ArrayRef<uint64_t> bigVal) {
  assert(BitWidth && "Bitwidth too small");
  assert(bigVal.data() && "Null pointer detected!");
  if (isSingleWord())
    U.VAL = bigVal[0];
  else {
    // Get memory, cleared to 0
    U.pVal = getClearedMemory(getNumWords());
    // Calculate the number of words to copy
    unsigned words = std::min<unsigned>(bigVal.size(), getNumWords());
    // Copy the words from bigVal to pVal
    memcpy(U.pVal, bigVal.data(), words * APINT_WORD_SIZE);
  }
  // Make sure unused high bits are cleared
  clearUnusedBits();
}